

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O3

int pfx_table_node2pfx_record(trie_node *node,pfx_record *records,uint ary_len)

{
  long lVar1;
  uint *puVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  rtr_socket **pprVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (uint *)node->data;
  uVar4 = 0xffffffff;
  if (*puVar2 <= ary_len) {
    if (*puVar2 == 0) {
      uVar4 = 0;
    }
    else {
      lVar7 = *(long *)(puVar2 + 2);
      pprVar6 = &records->socket;
      lVar5 = 0;
      uVar8 = 0;
      do {
        ((pfx_record *)(pprVar6 + -4))->asn = *(uint32_t *)(lVar7 + lVar5);
        uVar3 = *(undefined8 *)((long)&(node->prefix).u + 4);
        *(undefined8 *)((long)pprVar6 + -0x1c) = *(undefined8 *)&node->prefix;
        *(undefined8 *)((long)pprVar6 + -0x14) = uVar3;
        *(uint32_t *)((long)pprVar6 + -0xc) = (node->prefix).u.addr6.addr[3];
        *(uint8_t *)(pprVar6 + -1) = node->len;
        lVar7 = *(long *)(puVar2 + 2);
        *(uint8_t *)((long)pprVar6 + -7) = *(uint8_t *)(lVar7 + 4 + lVar5);
        *pprVar6 = *(rtr_socket **)(lVar7 + 8 + lVar5);
        uVar8 = uVar8 + 1;
        uVar4 = *puVar2;
        lVar5 = lVar5 + 0x10;
        pprVar6 = pprVar6 + 5;
      } while (uVar8 < uVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

int pfx_table_node2pfx_record(struct trie_node *node, struct pfx_record *records, const unsigned int ary_len)
{
	struct node_data *data = node->data;

	if (ary_len < data->len)
		return PFX_ERROR;

	for (unsigned int i = 0; i < data->len; i++) {
		records[i].asn = data->ary[i].asn;
		records[i].prefix = node->prefix;
		records[i].min_len = node->len;
		records[i].max_len = data->ary[i].max_len;
		records[i].socket = data->ary[i].socket;
	}
	return data->len;
}